

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limbo.cpp
# Opt level: O1

vector<field::GF2E,_std::allocator<field::GF2E>_> *
anon_unknown.dwarf_3dc0d::phase_2_expand
          (vector<field::GF2E,_std::allocator<field::GF2E>_> *__return_storage_ptr__,
          limbo_instance_t *instance,vector<unsigned_char,_std::allocator<unsigned_char>_> *h_2,
          vector<field::GF2E,_std::allocator<field::GF2E>_> *forbidden_values,size_t num_chall)

{
  BitSequence *data;
  iterator __position;
  bool bVar1;
  uint capacity;
  ulong uVar2;
  uint rate;
  pointer pGVar3;
  long lVar4;
  bool bVar5;
  GF2E candidate_R;
  vector<unsigned_char,_std::allocator<unsigned_char>_> lambda_sized_buffer;
  hash_context ctx;
  GF2E local_170;
  size_t local_168;
  size_t local_160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_158;
  Keccak_HashInstance local_140;
  
  if (instance->digest_size == 0x20) {
    rate = 0x540;
    capacity = 0x100;
  }
  else {
    rate = 0x440;
    capacity = 0x200;
  }
  local_168 = num_chall;
  Keccak_HashInitialize(&local_140,rate,capacity,0,'\x1f');
  data = (h_2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  Keccak_HashUpdate(&local_140,data,
                    ((long)(h_2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)data) * 8);
  Keccak_HashFinal(&local_140,(BitSequence *)0x0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_158,(ulong)instance->lambda,(allocator_type *)&local_170);
  (__return_storage_ptr__->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_168 != 0) {
    local_160 = 0;
    do {
      Keccak_HashSqueeze(&local_140,
                         local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         ((long)local_158.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_158.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start) * 8);
      local_170.data = 0;
      field::GF2E::from_bytes
                (&local_170,
                 local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start);
      pGVar3 = (forbidden_values->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
               _M_impl.super__Vector_impl_data._M_start;
      bVar5 = (forbidden_values->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
              _M_impl.super__Vector_impl_data._M_finish != pGVar3;
      if (bVar5) {
        lVar4 = 0;
        uVar2 = 0;
        do {
          bVar1 = field::GF2E::operator==(&local_170,(GF2E *)((long)&pGVar3->data + lVar4));
          if (bVar1) goto LAB_0010b505;
          uVar2 = uVar2 + 1;
          pGVar3 = (forbidden_values->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar4 = lVar4 + 8;
          bVar5 = uVar2 < (ulong)((long)(forbidden_values->
                                        super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pGVar3
                                 >> 3);
        } while (bVar5);
      }
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<field::GF2E,std::allocator<field::GF2E>>::_M_realloc_insert<field::GF2E_const&>
                  ((vector<field::GF2E,std::allocator<field::GF2E>> *)__return_storage_ptr__,
                   __position,&local_170);
      }
      else {
        (__position._M_current)->data = local_170.data;
        (__return_storage_ptr__->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
LAB_0010b505:
    } while ((bVar5) || (local_160 = local_160 + 1, local_160 != local_168));
  }
  if (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (BitSequence *)0x0) {
    operator_delete(local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<field::GF2E> phase_2_expand(
    const limbo_instance_t &instance, const std::vector<uint8_t> &h_2,
    const std::vector<field::GF2E> &forbidden_values, const size_t num_chall) {
  hash_context ctx;
  hash_init(&ctx, instance.digest_size);
  hash_update(&ctx, h_2.data(), h_2.size());
  hash_final(&ctx);

  std::vector<uint8_t> lambda_sized_buffer(instance.lambda);
  std::vector<field::GF2E> R_es;
  for (size_t e = 0; e < num_chall; e++) { // instance.num_rounds; e++) {
    while (true) {
      hash_squeeze(&ctx, lambda_sized_buffer.data(),
                   lambda_sized_buffer.size());
      //  check that R is not in {0,...m2-1}
      field::GF2E candidate_R;
      candidate_R.from_bytes(lambda_sized_buffer.data());
      bool good = true;
      for (size_t k = 0; k < forbidden_values.size(); k++) {
        if (candidate_R == forbidden_values[k]) {
          good = false;
          break;
        }
      }
      if (good) {
        R_es.push_back(candidate_R);
        break;
      }
    }
  }
  return R_es;
}